

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptor::DebugString
          (FieldDescriptor *this,int depth,PrintLabelFlag print_label_flag,string *contents,
          DebugStringOptions *debug_string_options)

{
  bool bVar1;
  Syntax SVar2;
  Label LVar3;
  Type TVar4;
  int value;
  FieldDescriptor *pFVar5;
  Descriptor *pDVar6;
  string *src;
  FieldOptions *options;
  FileDescriptor *pFVar7;
  DescriptorPool *pool;
  string *local_830;
  undefined1 local_7a8 [8];
  string formatted_options;
  SubstituteArg local_768;
  SubstituteArg local_738;
  SubstituteArg local_708;
  SubstituteArg local_6d8;
  SubstituteArg local_6a8;
  SubstituteArg local_678;
  SubstituteArg local_648;
  SubstituteArg local_618;
  SubstituteArg local_5e8;
  string local_5b8;
  SubstituteArg local_598;
  byte local_561;
  undefined1 local_560 [7];
  bool bracketed;
  SubstituteArg local_530;
  SubstituteArg local_500;
  SubstituteArg local_4d0;
  SubstituteArg local_4a0;
  SubstituteArg local_470;
  SubstituteArg local_440;
  SubstituteArg local_410;
  SubstituteArg local_3e0;
  SubstituteArg local_3b0;
  undefined1 local_380 [8];
  SourceLocationCommentPrinter comment_printer;
  string label;
  undefined1 local_2c0 [7];
  bool print_label;
  SubstituteArg local_2a0;
  SubstituteArg local_270;
  SubstituteArg local_240;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  string local_120;
  SubstituteArg local_100;
  string local_d0;
  SubstituteArg local_b0;
  undefined1 local_80 [8];
  string field_type;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string prefix;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  PrintLabelFlag print_label_flag_local;
  int depth_local;
  FieldDescriptor *this_local;
  
  prefix.field_2._8_8_ = debug_string_options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,(long)(depth * 2),' ',&local_49);
  std::allocator<char>::~allocator(&local_49);
  std::__cxx11::string::string((string *)local_80);
  bVar1 = is_map(this);
  if (bVar1) {
    pDVar6 = message_type(this);
    pFVar5 = Descriptor::field(pDVar6,0);
    FieldTypeNameDebugString_abi_cxx11_(&local_d0,pFVar5);
    strings::internal::SubstituteArg::SubstituteArg(&local_b0,&local_d0);
    pDVar6 = message_type(this);
    pFVar5 = Descriptor::field(pDVar6,1);
    FieldTypeNameDebugString_abi_cxx11_(&local_120,pFVar5);
    strings::internal::SubstituteArg::SubstituteArg(&local_100,&local_120);
    strings::internal::SubstituteArg::SubstituteArg(&local_150);
    strings::internal::SubstituteArg::SubstituteArg(&local_180);
    strings::internal::SubstituteArg::SubstituteArg(&local_1b0);
    strings::internal::SubstituteArg::SubstituteArg(&local_1e0);
    strings::internal::SubstituteArg::SubstituteArg(&local_210);
    strings::internal::SubstituteArg::SubstituteArg(&local_240);
    strings::internal::SubstituteArg::SubstituteArg(&local_270);
    strings::internal::SubstituteArg::SubstituteArg(&local_2a0);
    strings::SubstituteAndAppend
              ((string *)local_80,"map<$0, $1>",&local_b0,&local_100,&local_150,&local_180,
               &local_1b0,&local_1e0,&local_210,&local_240,&local_270,&local_2a0);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    FieldTypeNameDebugString_abi_cxx11_((string *)local_2c0,this);
    std::__cxx11::string::operator=((string *)local_80,(string *)local_2c0);
    std::__cxx11::string::~string((string *)local_2c0);
  }
  bVar1 = is_optional(this);
  if (bVar1) {
    if (print_label_flag != OMIT_LABEL) {
      pFVar7 = file(this);
      SVar2 = FileDescriptor::syntax(pFVar7);
      if (SVar2 != SYNTAX_PROTO3) goto LAB_004d7b24;
    }
    label.field_2._M_local_buf[0xf] = false;
  }
  else {
LAB_004d7b24:
    bVar1 = is_map(this);
    label.field_2._M_local_buf[0xf] = !bVar1;
  }
  std::__cxx11::string::string((string *)(comment_printer.prefix_.field_2._M_local_buf + 8));
  if ((bool)label.field_2._M_local_buf[0xf]) {
    LVar3 = FieldDescriptor::label(this);
    std::__cxx11::string::operator=
              ((string *)(comment_printer.prefix_.field_2._M_local_buf + 8),
               *(char **)(kLabelToName + (ulong)LVar3 * 8));
    std::__cxx11::string::push_back((char)&comment_printer + -0x70);
  }
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::FieldDescriptor>
            ((SourceLocationCommentPrinter *)local_380,this,(string *)local_48,
             (DebugStringOptions *)prefix.field_2._8_8_);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_380,contents);
  strings::internal::SubstituteArg::SubstituteArg(&local_3b0,(string *)local_48);
  strings::internal::SubstituteArg::SubstituteArg
            (&local_3e0,(string *)((long)&comment_printer.prefix_.field_2 + 8));
  strings::internal::SubstituteArg::SubstituteArg(&local_410,(string *)local_80);
  TVar4 = type(this);
  if (TVar4 == TYPE_GROUP) {
    pDVar6 = message_type(this);
    local_830 = Descriptor::name_abi_cxx11_(pDVar6);
  }
  else {
    local_830 = name_abi_cxx11_(this);
  }
  strings::internal::SubstituteArg::SubstituteArg(&local_440,local_830);
  value = number(this);
  strings::internal::SubstituteArg::SubstituteArg(&local_470,value);
  strings::internal::SubstituteArg::SubstituteArg(&local_4a0);
  strings::internal::SubstituteArg::SubstituteArg(&local_4d0);
  strings::internal::SubstituteArg::SubstituteArg(&local_500);
  strings::internal::SubstituteArg::SubstituteArg(&local_530);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_560);
  strings::SubstituteAndAppend
            (contents,"$0$1$2 $3 = $4",&local_3b0,&local_3e0,&local_410,&local_440,&local_470,
             &local_4a0,&local_4d0,&local_500,&local_530,(SubstituteArg *)local_560);
  local_561 = 0;
  bVar1 = has_default_value(this);
  if (bVar1) {
    local_561 = 1;
    DefaultValueAsString_abi_cxx11_(&local_5b8,this,true);
    strings::internal::SubstituteArg::SubstituteArg(&local_598,&local_5b8);
    strings::internal::SubstituteArg::SubstituteArg(&local_5e8);
    strings::internal::SubstituteArg::SubstituteArg(&local_618);
    strings::internal::SubstituteArg::SubstituteArg(&local_648);
    strings::internal::SubstituteArg::SubstituteArg(&local_678);
    strings::internal::SubstituteArg::SubstituteArg(&local_6a8);
    strings::internal::SubstituteArg::SubstituteArg(&local_6d8);
    strings::internal::SubstituteArg::SubstituteArg(&local_708);
    strings::internal::SubstituteArg::SubstituteArg(&local_738);
    strings::internal::SubstituteArg::SubstituteArg(&local_768);
    strings::SubstituteAndAppend
              (contents," [default = $0",&local_598,&local_5e8,&local_618,&local_648,&local_678,
               &local_6a8,&local_6d8,&local_708,&local_738,&local_768);
    std::__cxx11::string::~string((string *)&local_5b8);
  }
  if (((byte)this[0x20] & 1) != 0) {
    if ((local_561 & 1) == 0) {
      local_561 = 1;
      std::__cxx11::string::append((char *)contents);
    }
    else {
      std::__cxx11::string::append((char *)contents);
    }
    std::__cxx11::string::append((char *)contents);
    src = json_name_abi_cxx11_(this);
    CEscape((string *)((long)&formatted_options.field_2 + 8),src);
    std::__cxx11::string::append((string *)contents);
    std::__cxx11::string::~string((string *)(formatted_options.field_2._M_local_buf + 8));
    std::__cxx11::string::append((char *)contents);
  }
  std::__cxx11::string::string((string *)local_7a8);
  options = FieldDescriptor::options(this);
  pFVar7 = file(this);
  pool = FileDescriptor::pool(pFVar7);
  bVar1 = anon_unknown_1::FormatBracketedOptions
                    (depth,&options->super_Message,pool,(string *)local_7a8);
  if (bVar1) {
    std::__cxx11::string::append((char *)contents);
    local_561 = 1;
    std::__cxx11::string::append((string *)contents);
  }
  if ((local_561 & 1) != 0) {
    std::__cxx11::string::append((char *)contents);
  }
  TVar4 = type(this);
  if (TVar4 == TYPE_GROUP) {
    if ((*(byte *)(prefix.field_2._8_8_ + 1) & 1) == 0) {
      pDVar6 = message_type(this);
      Descriptor::DebugString
                (pDVar6,depth,contents,(DebugStringOptions *)prefix.field_2._8_8_,false);
    }
    else {
      std::__cxx11::string::append((char *)contents);
    }
  }
  else {
    std::__cxx11::string::append((char *)contents);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_380,contents);
  std::__cxx11::string::~string((string *)local_7a8);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_380);
  std::__cxx11::string::~string((string *)(comment_printer.prefix_.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void FieldDescriptor::DebugString(int depth,
                                  PrintLabelFlag print_label_flag,
                                  string *contents,
                                  const DebugStringOptions&
                                  debug_string_options) const {
  string prefix(depth * 2, ' ');
  string field_type;

  // Special case map fields.
  if (is_map()) {
    strings::SubstituteAndAppend(
        &field_type, "map<$0, $1>",
        message_type()->field(0)->FieldTypeNameDebugString(),
        message_type()->field(1)->FieldTypeNameDebugString());
  } else {
    field_type = FieldTypeNameDebugString();
  }

  bool print_label = true;
  // Determine whether to omit label:
  //   1. For an optional field, omit label if it's in oneof or in proto3.
  //   2. For a repeated field, omit label if it's a map.
  if (is_optional() && (print_label_flag == OMIT_LABEL ||
                        file()->syntax() == FileDescriptor::SYNTAX_PROTO3)) {
    print_label = false;
  } else if (is_map()) {
    print_label = false;
  }
  string label;
  if (print_label) {
    label = kLabelToName[this->label()];
    label.push_back(' ');
  }

  SourceLocationCommentPrinter
      comment_printer(this, prefix, debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "$0$1$2 $3 = $4",
                               prefix,
                               label,
                               field_type,
                               type() == TYPE_GROUP ? message_type()->name() :
                                                      name(),
                               number());

  bool bracketed = false;
  if (has_default_value()) {
    bracketed = true;
    strings::SubstituteAndAppend(contents, " [default = $0",
                                 DefaultValueAsString(true));
  }
  if (has_json_name_) {
    if (!bracketed) {
      bracketed = true;
      contents->append("[");
    } else {
      contents->append(", ");
    }
    contents->append("json_name = \"");
    contents->append(CEscape(json_name()));
    contents->append("\"");
  }

  string formatted_options;
  if (FormatBracketedOptions(depth, options(), file()->pool(),
                             &formatted_options)) {
    contents->append(bracketed ? ", " : " [");
    bracketed = true;
    contents->append(formatted_options);
  }

  if (bracketed) {
    contents->append("]");
  }

  if (type() == TYPE_GROUP) {
    if (debug_string_options.elide_group_body) {
      contents->append(" { ... };\n");
    } else {
      message_type()->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ false);
    }
  } else {
    contents->append(";\n");
  }

  comment_printer.AddPostComment(contents);
}